

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  cmake *this_00;
  cmGeneratedFileStream *pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  _Alloc_hider _Var7;
  string sStack_1c8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1a8;
  ostringstream msg;
  pointer local_190;
  
  RequiredNinjaVersion_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::operator<<((ostream *)&msg,"The detected version of Ninja (");
    std::operator<<(poVar5,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)&msg,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar5 = std::operator<<((ostream *)&msg,(string *)&sStack_1c8);
    std::operator<<(poVar5,").");
    std::__cxx11::string::~string((string *)&sStack_1c8);
    this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_1a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1a8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&sStack_1c8,(cmListFileBacktrace *)&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x4a])(this);
    if ((char)iVar3 != '\0') {
      bVar2 = OpenRulesFileStream(this);
      if (bVar2) {
        for (p_Var6 = (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          std::
          _Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::clear((_Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(p_Var6 + 5));
        }
        InitOutputPathPrefix(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_1c8,"all",(allocator<char> *)&local_1a8);
        NinjaOutputPath((string *)&msg,this,&sStack_1c8);
        std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_1c8,"CMakeCache.txt",(allocator<char> *)&local_1a8);
        NinjaOutputPath((string *)&msg,this,&sStack_1c8);
        std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        this->DisableCleandead = false;
        this->DiagnosedCxxModuleSupport = false;
        PVar4 = cmMakefile::GetPolicyStatus
                          (*(cmMakefile **)
                            ((long)(((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                                     LocalGenerators.
                                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                   ._M_t + 0x70),CMP0058,false);
        this->PolicyCMP0058 = PVar4;
        this->ComputingUnknownDependencies = PVar4 < NEW;
        cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
        WriteAssumedSourceDependencies(this);
        iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x44])(this);
        WriteTargetAliases(this,(ostream *)CONCAT44(extraout_var,iVar3));
        iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x44])(this);
        WriteFolderTargets(this,(ostream *)CONCAT44(extraout_var_00,iVar3));
        iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x44])(this);
        WriteUnknownExplicitDependencies(this,(ostream *)CONCAT44(extraout_var_01,iVar3));
        iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x44])(this);
        WriteBuiltinTargets(this,(ostream *)CONCAT44(extraout_var_02,iVar3));
        bVar2 = cmSystemTools::GetErrorOccurredFlag();
        if (bVar2) {
          pcVar1 = (this->RulesFileStream)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          std::ios::setstate((int)pcVar1 +
                             (int)*(undefined8 *)
                                   (*(long *)&(pcVar1->super_ofstream).
                                              super_basic_ostream<char,_std::char_traits<char>_> +
                                   -0x18));
          cmMakefile::GetGeneratorConfigs_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&msg,(cmMakefile *)
                             (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                               Makefiles.
                               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                             _M_t,IncludeEmptyConfig);
          for (_Var7._M_p = _msg; _Var7._M_p != local_190; _Var7._M_p = _Var7._M_p + 0x20) {
            iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x41])(this,_Var7._M_p);
            std::ios::setstate(iVar3 + (int)*(undefined8 *)
                                             (*(long *)CONCAT44(extraout_var_03,iVar3) + -0x18));
            iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x42])(this,_Var7._M_p);
            std::ios::setstate(iVar3 + (int)*(undefined8 *)
                                             (*(long *)CONCAT44(extraout_var_04,iVar3) + -0x18));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&msg);
          iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x44])(this);
          std::ios::setstate(iVar3 + (int)*(undefined8 *)
                                           (*(long *)CONCAT44(extraout_var_05,iVar3) + -0x18));
        }
        CloseCompileCommandsStream(this);
        CloseRulesFileStream(this);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x4b])(this);
        CleanMetaData(this);
      }
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                    RequiredNinjaVersion())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << cmGlobalNinjaGenerator::RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return;
  }
  if (!this->OpenBuildFileStreams()) {
    return;
  }
  if (!this->OpenRulesFileStream()) {
    return;
  }

  for (auto& it : this->Configs) {
    it.second.TargetDependsClosures.clear();
  }

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");
  this->DisableCleandead = false;
  this->DiagnosedCxxModuleSupport = false;

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->GetCommonFileStream());
  this->WriteFolderTargets(*this->GetCommonFileStream());
  this->WriteUnknownExplicitDependencies(*this->GetCommonFileStream());
  this->WriteBuiltinTargets(*this->GetCommonFileStream());

  if (cmSystemTools::GetErrorOccurredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->GetImplFileStream(config)->setstate(std::ios::failbit);
      this->GetConfigFileStream(config)->setstate(std::ios::failbit);
    }
    this->GetCommonFileStream()->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStreams();

#ifdef _WIN32
  // Older ninja tools will not be able to update metadata on Windows
  // when we are re-generating inside an existing 'ninja' invocation
  // because the outer tool has the files open for write.
  if (this->NinjaSupportsMetadataOnRegeneration ||
      !this->GetCMakeInstance()->GetRegenerateDuringBuild())
#endif
  {
    this->CleanMetaData();
  }
}